

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5MultiIterAdvanceRowid(Fts5Iter *pIter,int iChanged,Fts5SegIter **ppFirst)

{
  Fts5CResult *pFVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  Fts5SegIter *pFVar5;
  long lVar6;
  uint uVar7;
  Fts5SegIter *pFVar8;
  uint uVar9;
  
  pFVar5 = pIter->aSeg + (uint)iChanged;
  lVar6 = pIter->aSeg[(uint)iChanged].iRowid;
  if (lVar6 == pIter->iSwitchRowid) {
    uVar9 = pIter->bRev;
  }
  else {
    uVar9 = (uint)(lVar6 < pIter->iSwitchRowid);
    if (pIter->bRev != uVar9) goto LAB_001a4afb;
  }
  uVar4 = (ulong)(iChanged ^ 1);
  lVar6 = -0x8000000000000000;
  if (uVar9 == 0) {
    lVar6 = 0x7fffffffffffffff;
  }
  pIter->iSwitchRowid = lVar6;
  pFVar1 = pIter->aFirst;
  pFVar8 = pFVar5;
  uVar7 = iChanged + pIter->nSeg;
  while( true ) {
    uVar3 = (int)uVar7 / 2;
    pFVar5 = pFVar8;
    if (pFVar1[(int)uVar3].bTermEq != '\0') {
      pFVar5 = pIter->aSeg + uVar4;
      lVar2 = pFVar5->iRowid;
      if (pFVar8->iRowid == lVar2) {
        return 1;
      }
      if ((uVar9 == pFVar8->iRowid < lVar2) || (pFVar5 = pFVar8, uVar9 == lVar6 < lVar2)) {
        pIter->iSwitchRowid = lVar2;
        lVar6 = lVar2;
      }
    }
    pFVar1[(int)uVar3].iFirst = (u16)(((long)pFVar5 - (long)pIter->aSeg) / 0x78);
    if ((uVar7 & 0xfffffffe) == 2) break;
    uVar4 = (ulong)pFVar1[(int)(uVar3 ^ 1)].iFirst;
    pFVar8 = pFVar5;
    uVar7 = uVar3;
  }
LAB_001a4afb:
  *ppFirst = pFVar5;
  return 0;
}

Assistant:

static int fts5MultiIterAdvanceRowid(
  Fts5Iter *pIter,                /* Iterator to update aFirst[] array for */
  int iChanged,                   /* Index of sub-iterator just advanced */
  Fts5SegIter **ppFirst
){
  Fts5SegIter *pNew = &pIter->aSeg[iChanged];

  if( pNew->iRowid==pIter->iSwitchRowid
   || (pNew->iRowid<pIter->iSwitchRowid)==pIter->bRev
  ){
    int i;
    Fts5SegIter *pOther = &pIter->aSeg[iChanged ^ 0x0001];
    pIter->iSwitchRowid = pIter->bRev ? SMALLEST_INT64 : LARGEST_INT64;
    for(i=(pIter->nSeg+iChanged)/2; 1; i=i/2){
      Fts5CResult *pRes = &pIter->aFirst[i];

      assert( pNew->pLeaf );
      assert( pRes->bTermEq==0 || pOther->pLeaf );

      if( pRes->bTermEq ){
        if( pNew->iRowid==pOther->iRowid ){
          return 1;
        }else if( (pOther->iRowid>pNew->iRowid)==pIter->bRev ){
          pIter->iSwitchRowid = pOther->iRowid;
          pNew = pOther;
        }else if( (pOther->iRowid>pIter->iSwitchRowid)==pIter->bRev ){
          pIter->iSwitchRowid = pOther->iRowid;
        }
      }
      pRes->iFirst = (u16)(pNew - pIter->aSeg);
      if( i==1 ) break;

      pOther = &pIter->aSeg[ pIter->aFirst[i ^ 0x0001].iFirst ];
    }
  }

  *ppFirst = pNew;
  return 0;
}